

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

value_type * __thiscall
poplar::
map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::update(map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
         *this,char_range key)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  bool bVar3;
  ulong uVar4;
  value_type *pvVar5;
  undefined8 *puVar6;
  byte bVar7;
  char *pcVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint64_t pos;
  uint8_t *puVar11;
  pair<const_int_*,_unsigned_long> pVar12;
  char_range key_local;
  uint64_t node_id;
  
  key_local.end = key.end;
  puVar11 = key.begin;
  key_local.begin = puVar11;
  if (puVar11 == key_local.end) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar6 = &PTR__exception_00123d68;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (key_local.end[-1] == '\0') {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map((map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
               *)&node_id,0,0x20);
          operator=(this,(map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
                          *)&node_id);
          ~map((map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
                *)&node_id);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        pos = 0;
LAB_001159fc:
        pvVar5 = compact_bonsai_nlm<int,_16UL>::insert(&this->label_store_,pos,&key_local);
      }
      else {
        node_id = 0;
        while( true ) {
          puVar2 = key_local.end;
          key_local.begin = puVar11;
          pVar12 = compact_bonsai_nlm<int,_16UL>::compare(&this->label_store_,node_id,&key_local);
          uVar10 = pVar12.second;
          pvVar5 = pVar12.first;
          if ((puVar11 == puVar2) || (pvVar5 != (value_type *)0x0)) break;
          key_local.begin = key_local.begin + uVar10;
          uVar4 = this->lambda_;
          for (; uVar4 <= uVar10; uVar10 = uVar10 - uVar4) {
            bVar3 = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                    ::add_child(&this->hash_trie_,&node_id,0xff);
            if (bVar3) {
              expand_if_needed_(this,&node_id);
            }
            uVar4 = this->lambda_;
          }
          bVar7 = (this->codes_)._M_elems[*key_local.begin];
          if (bVar7 == 0xff) {
            uVar1 = this->num_codes_;
            uVar9 = uVar1 + 1;
            this->num_codes_ = uVar9;
            (this->codes_)._M_elems[*key_local.begin] = (uchar)uVar1;
            if (uVar9 == 0xff) {
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar6 = &PTR__exception_00123d68;
              pcVar8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
              ;
              goto LAB_00115a62;
            }
            bVar7 = (this->codes_)._M_elems[*key_local.begin];
          }
          bVar3 = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                  ::add_child(&this->hash_trie_,&node_id,uVar10 << 8 | (ulong)bVar7);
          if (bVar3) {
            expand_if_needed_(this,&node_id);
            key_local.begin = key_local.begin + 1;
            this->size_ = this->size_ + 1;
            pos = node_id;
            goto LAB_001159fc;
          }
          puVar11 = key_local.begin + 1;
        }
      }
      return pvVar5;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar6 = &PTR__exception_00123d68;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_00115a62:
  puVar6[1] = pcVar8;
  __cxa_throw(puVar6,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }